

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void std::
     __move_merge_adaptive_backward<QList<int>::iterator,int*,QList<int>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
               (int *__first1,int *__last1,int *__first2,int *__last2,int *__result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  
  if (__first1 == __last1) {
    lVar3 = (long)__last2 - (long)__first2 >> 2;
    if (0 < lVar3) {
      lVar2 = 0;
      do {
        __result[lVar2 + -1] = __last2[lVar2 + -1];
        lVar1 = lVar3 + lVar2;
        lVar2 = lVar2 + -1;
      } while (1 < lVar1);
    }
  }
  else if (__first2 != __last2) {
    __last2 = __last2 + -1;
    do {
      __last1 = __last1 + -1;
      piVar4 = __result;
      while( true ) {
        __result = piVar4 + -1;
        if (*__last1 < *__last2) break;
        *__result = *__last2;
        if (__last2 == __first2) {
          return;
        }
        __last2 = __last2 + -1;
        piVar4 = __result;
      }
      *__result = *__last1;
    } while (__last1 != __first1);
    lVar3 = (long)__last2 + (4 - (long)__first2) >> 2;
    if (0 < lVar3) {
      lVar2 = 0;
      do {
        piVar4[lVar2 + -2] = __last2[lVar2];
        lVar1 = lVar3 + lVar2;
        lVar2 = lVar2 + -1;
      } while (1 < lVar1);
    }
  }
  return;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }